

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O2

int Am_Bottom_Is_Bottom_Of_Owner_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object owner;
  
  iVar2 = 0;
  pAVar4 = Am_Object::Get(self,0x67,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
  if (pAVar5 != (Am_Wrapper *)0x0) {
    pAVar4 = Am_Object::Get(&owner,0x67,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar4);
    pAVar4 = Am_Object::Get(&owner,0xa1,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    iVar2 = iVar2 - (iVar1 + iVar3);
  }
  Am_Object::~Am_Object(&owner);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, Am_Bottom_Is_Bottom_Of_Owner)
{
  int my_height = self.Get(Am_HEIGHT);
  Am_Object owner = self.Get_Owner();
  if (owner) {
    int owner_height = owner.Get(Am_HEIGHT);
    int bottom_offset = owner.Get(Am_BOTTOM_OFFSET);
    return owner_height - my_height - bottom_offset;
  } else {
    return 0;
  }
}